

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O2

int __thiscall
gl4cts::ShaderImageLoadStoreTests::init(ShaderImageLoadStoreTests *this,EVP_PKEY_CTX *ctx)

{
  Context *context;
  int extraout_EAX;
  TestSubcase *pTVar1;
  
  context = (this->super_TestCaseGroup).m_context;
  gl4cts::(anonymous_namespace)::currentLog = context->m_testCtx->m_log;
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,context,"basic-api-get",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAPIGet>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-api-bind",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAPIBind>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-api-barrier",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAPIBarrier>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-api-texParam",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAPITexParam>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allFormats-store",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllFormatsStore>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allFormats-load",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllFormatsLoad>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allFormats-storeGeometryStages",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allFormats-loadGeometryStages",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::BasicAllFormatsLoadGeometryStages>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allFormats-loadStoreComputeStage",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::BasicAllFormatsLoadStoreComputeStage>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-store",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsStore>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-load-nonMS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadNonMS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-load-ms",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadMS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-atomic",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsAtomic>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-loadStoreVS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreVS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-loadStoreTCS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreTCS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-loadStoreTES",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreTES>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-loadStoreGS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreGS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-loadStoreCS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsLoadStoreCS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-atomicVS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsAtomicVS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-atomicTCS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsAtomicTCS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-atomicGS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsAtomicGS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-allTargets-atomicCS",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicAllTargetsAtomicCS>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-glsl-misc",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicGLSLMisc>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-glsl-earlyFragTests",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicGLSLEarlyFragTests>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"basic-glsl-const",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::BasicGLSLConst>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-imageAccess",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncImageAccess>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-vertexArray",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncVertexArray>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-drawIndirect",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncDrawIndirect>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-textureUpdate",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncTextureUpdate>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-imageAccess2",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncImageAccess2>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sync-bufferUpdate",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSyncBufferUpdate>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-allStages-oneImage",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedAllStagesOneImage>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-memory-dependentInvocation",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::AdvancedMemoryDependentInvocation>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-memory-order",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedMemoryOrder>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sso-simple",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSSOSimple>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sso-atomicCounters",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSSOAtomicCounters>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sso-subroutine",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSSOSubroutine>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-sso-perSample",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedSSOPerSample>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-copyImage",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedCopyImage>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-allMips",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedAllMips>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"advanced-cast",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::AdvancedCast>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"single-byte_data_alignment",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreDataAlignmentTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"non-layered_binding",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreNonLayeredBindingTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"incomplete_textures",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreIncompleteTexturesTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"multiple-uniforms",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreMultipleUniformsTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"early-fragment-tests",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreEarlyFragmentTestsTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-uniform",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::NegativeUniform>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-bind",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::NegativeBind>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-compileErrors",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::NegativeCompileErrors>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"negative-linkErrors",
             deqp::TestSubcase::Create<gl4cts::(anonymous_namespace)::NegativeLinkErrors>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  pTVar1 = (TestSubcase *)operator_new(0x88);
  deqp::TestSubcase::TestSubcase
            (pTVar1,(this->super_TestCaseGroup).m_context,"uniform-limits",
             deqp::TestSubcase::
             Create<gl4cts::(anonymous_namespace)::ImageLoadStoreUniformLimitsTest>);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar1);
  return extraout_EAX;
}

Assistant:

void ShaderImageLoadStoreTests::init()
{
	using namespace deqp;
	setOutput(m_context.getTestContext().getLog());
	addChild(new TestSubcase(m_context, "basic-api-get", TestSubcase::Create<BasicAPIGet>));
	addChild(new TestSubcase(m_context, "basic-api-bind", TestSubcase::Create<BasicAPIBind>));
	addChild(new TestSubcase(m_context, "basic-api-barrier", TestSubcase::Create<BasicAPIBarrier>));
	addChild(new TestSubcase(m_context, "basic-api-texParam", TestSubcase::Create<BasicAPITexParam>));
	addChild(new TestSubcase(m_context, "basic-allFormats-store", TestSubcase::Create<BasicAllFormatsStore>));
	addChild(new TestSubcase(m_context, "basic-allFormats-load", TestSubcase::Create<BasicAllFormatsLoad>));
	addChild(new TestSubcase(m_context, "basic-allFormats-storeGeometryStages",
							 TestSubcase::Create<BasicAllFormatsStoreGeometryStages>));
	addChild(new TestSubcase(m_context, "basic-allFormats-loadGeometryStages",
							 TestSubcase::Create<BasicAllFormatsLoadGeometryStages>));
	addChild(new TestSubcase(m_context, "basic-allFormats-loadStoreComputeStage",
							 TestSubcase::Create<BasicAllFormatsLoadStoreComputeStage>));
	addChild(new TestSubcase(m_context, "basic-allTargets-store", TestSubcase::Create<BasicAllTargetsStore>));
	addChild(new TestSubcase(m_context, "basic-allTargets-load-nonMS", TestSubcase::Create<BasicAllTargetsLoadNonMS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-load-ms", TestSubcase::Create<BasicAllTargetsLoadMS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-atomic", TestSubcase::Create<BasicAllTargetsAtomic>));
	addChild(
		new TestSubcase(m_context, "basic-allTargets-loadStoreVS", TestSubcase::Create<BasicAllTargetsLoadStoreVS>));
	addChild(
		new TestSubcase(m_context, "basic-allTargets-loadStoreTCS", TestSubcase::Create<BasicAllTargetsLoadStoreTCS>));
	addChild(
		new TestSubcase(m_context, "basic-allTargets-loadStoreTES", TestSubcase::Create<BasicAllTargetsLoadStoreTES>));
	addChild(
		new TestSubcase(m_context, "basic-allTargets-loadStoreGS", TestSubcase::Create<BasicAllTargetsLoadStoreGS>));
	addChild(
		new TestSubcase(m_context, "basic-allTargets-loadStoreCS", TestSubcase::Create<BasicAllTargetsLoadStoreCS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-atomicVS", TestSubcase::Create<BasicAllTargetsAtomicVS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-atomicTCS", TestSubcase::Create<BasicAllTargetsAtomicTCS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-atomicGS", TestSubcase::Create<BasicAllTargetsAtomicGS>));
	addChild(new TestSubcase(m_context, "basic-allTargets-atomicCS", TestSubcase::Create<BasicAllTargetsAtomicCS>));
	addChild(new TestSubcase(m_context, "basic-glsl-misc", TestSubcase::Create<BasicGLSLMisc>));
	addChild(new TestSubcase(m_context, "basic-glsl-earlyFragTests", TestSubcase::Create<BasicGLSLEarlyFragTests>));
	addChild(new TestSubcase(m_context, "basic-glsl-const", TestSubcase::Create<BasicGLSLConst>));
	addChild(new TestSubcase(m_context, "advanced-sync-imageAccess", TestSubcase::Create<AdvancedSyncImageAccess>));
	addChild(new TestSubcase(m_context, "advanced-sync-vertexArray", TestSubcase::Create<AdvancedSyncVertexArray>));
	addChild(new TestSubcase(m_context, "advanced-sync-drawIndirect", TestSubcase::Create<AdvancedSyncDrawIndirect>));
	addChild(new TestSubcase(m_context, "advanced-sync-textureUpdate", TestSubcase::Create<AdvancedSyncTextureUpdate>));
	addChild(new TestSubcase(m_context, "advanced-sync-imageAccess2", TestSubcase::Create<AdvancedSyncImageAccess2>));
	addChild(new TestSubcase(m_context, "advanced-sync-bufferUpdate", TestSubcase::Create<AdvancedSyncBufferUpdate>));
	addChild(new TestSubcase(m_context, "advanced-allStages-oneImage", TestSubcase::Create<AdvancedAllStagesOneImage>));
	addChild(new TestSubcase(m_context, "advanced-memory-dependentInvocation",
							 TestSubcase::Create<AdvancedMemoryDependentInvocation>));
	addChild(new TestSubcase(m_context, "advanced-memory-order", TestSubcase::Create<AdvancedMemoryOrder>));
	addChild(new TestSubcase(m_context, "advanced-sso-simple", TestSubcase::Create<AdvancedSSOSimple>));
	addChild(new TestSubcase(m_context, "advanced-sso-atomicCounters", TestSubcase::Create<AdvancedSSOAtomicCounters>));
	addChild(new TestSubcase(m_context, "advanced-sso-subroutine", TestSubcase::Create<AdvancedSSOSubroutine>));
	addChild(new TestSubcase(m_context, "advanced-sso-perSample", TestSubcase::Create<AdvancedSSOPerSample>));
	addChild(new TestSubcase(m_context, "advanced-copyImage", TestSubcase::Create<AdvancedCopyImage>));
	addChild(new TestSubcase(m_context, "advanced-allMips", TestSubcase::Create<AdvancedAllMips>));
	addChild(new TestSubcase(m_context, "advanced-cast", TestSubcase::Create<AdvancedCast>));
	addChild(
		new TestSubcase(m_context, "single-byte_data_alignment", TestSubcase::Create<ImageLoadStoreDataAlignmentTest>));
	addChild(
		new TestSubcase(m_context, "non-layered_binding", TestSubcase::Create<ImageLoadStoreNonLayeredBindingTest>));
	addChild(
		new TestSubcase(m_context, "incomplete_textures", TestSubcase::Create<ImageLoadStoreIncompleteTexturesTest>));
	addChild(new TestSubcase(m_context, "multiple-uniforms", TestSubcase::Create<ImageLoadStoreMultipleUniformsTest>));
	addChild(
		new TestSubcase(m_context, "early-fragment-tests", TestSubcase::Create<ImageLoadStoreEarlyFragmentTestsTest>));
	addChild(new TestSubcase(m_context, "negative-uniform", TestSubcase::Create<NegativeUniform>));
	addChild(new TestSubcase(m_context, "negative-bind", TestSubcase::Create<NegativeBind>));
	addChild(new TestSubcase(m_context, "negative-compileErrors", TestSubcase::Create<NegativeCompileErrors>));
	addChild(new TestSubcase(m_context, "negative-linkErrors", TestSubcase::Create<NegativeLinkErrors>));
	addChild(new TestSubcase(m_context, "uniform-limits", TestSubcase::Create<ImageLoadStoreUniformLimitsTest>));
}